

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O0

int __thiscall QFile::open(QFile *this,char *__file,int __oflag,...)

{
  bool bVar1;
  QFlags<QIODeviceBase::OpenModeFlag> QVar2;
  int iVar3;
  QFilePrivate *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long in_FS_OFFSET;
  undefined1 auVar4 [12];
  FileError err;
  QFilePrivate *d;
  OpenModeFlag in_stack_ffffffffffffff2c;
  enum_type in_stack_ffffffffffffff30;
  enum_type in_stack_ffffffffffffff34;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> other;
  char *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  bool local_61;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_48;
  uint local_44;
  CompareAgainstLiteralZero local_19;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_18;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> local_14;
  _Optional_payload_base<QFlags<QFileDevice::Permission>_> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_14.i = (Int)__file;
  this_00 = d_func((QFile *)0x11ccc7);
  bVar1 = QIODevice::isOpen((QIODevice *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  if (bVar1) {
    local_61 = file_already_open((QFile *)CONCAT44(in_stack_ffffffffffffff44,
                                                   in_stack_ffffffffffffff40),
                                 in_stack_ffffffffffffff38);
  }
  else {
    operator|(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
    other.i = (Int)in_stack_ffffffffffffff38;
    local_18.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
         (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
         QFlags<QIODeviceBase::OpenModeFlag>::operator&
                   ((QFlags<QIODeviceBase::OpenModeFlag> *)
                    CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    (QFlags<QIODeviceBase::OpenModeFlag>)other.i);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_18);
    if (bVar1) {
      QFlags<QIODeviceBase::OpenModeFlag>::operator|=
                ((QFlags<QIODeviceBase::OpenModeFlag> *)&local_14,WriteOnly);
    }
    QFileDevice::unsetError
              ((QFileDevice *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    operator|(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
    QVar2 = QFlags<QIODeviceBase::OpenModeFlag>::operator&
                      ((QFlags<QIODeviceBase::OpenModeFlag> *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (QFlags<QIODeviceBase::OpenModeFlag>)other.i);
    QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_19,0);
    bVar1 = ::operator==(QVar2.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                         super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
    if (bVar1) {
      local_61 = false;
    }
    else {
      iVar3 = (*(this_00->super_QFileDevicePrivate).super_QIODevicePrivate._vptr_QIODevicePrivate[5]
              )();
      QVar2 = QFlags<QIODeviceBase::OpenModeFlag>::operator|
                        ((QFlags<QIODeviceBase::OpenModeFlag> *)
                         CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         in_stack_ffffffffffffff2c);
      std::optional<QFlags<QFileDevice::Permission>_>::optional
                ((optional<QFlags<QFileDevice::Permission>_> *)&local_10);
      auVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
                         ((long *)CONCAT44(extraout_var,iVar3),
                          QVar2.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                          super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i,local_10);
      if ((auVar4 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
        std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                  ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                   0x11ceb4);
        QAbstractFileEngine::error
                  ((QAbstractFileEngine *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                  ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                   0x11cef2);
        QAbstractFileEngine::errorString((QAbstractFileEngine *)this_00);
        QFileDevicePrivate::setError
                  ((QFileDevicePrivate *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   in_stack_ffffffffffffff2c,(QString *)0x11cf12);
        QString::~QString((QString *)0x11cf1c);
        local_61 = false;
      }
      else {
        local_44 = local_14.i;
        QIODevice::open((QIODevice *)this,(char *)(ulong)local_14.i,auVar4._8_4_);
        local_48.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
             (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
             QFlags<QIODeviceBase::OpenModeFlag>::operator&
                       ((QFlags<QIODeviceBase::OpenModeFlag> *)
                        CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        in_stack_ffffffffffffff2c);
        bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_48);
        if (bVar1) {
          iVar3 = (*(this->super_QFileDevice).super_QIODevice._vptr_QIODevice[6])();
          (*(this->super_QFileDevice).super_QIODevice._vptr_QIODevice[7])
                    (this,CONCAT44(extraout_var_00,iVar3));
        }
        local_61 = true;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_61);
}

Assistant:

bool QFile::open(OpenMode mode)
{
    Q_D(QFile);
    if (isOpen())
        return file_already_open(*this);
    // Either Append or NewOnly implies WriteOnly
    if (mode & (Append | NewOnly))
        mode |= WriteOnly;
    unsetError();
    if ((mode & (ReadOnly | WriteOnly)) == 0) {
        qWarning("QIODevice::open: File access not specified");
        return false;
    }

    // QIODevice provides the buffering, so there's no need to request it from the file engine.
    if (d->engine()->open(mode | QIODevice::Unbuffered)) {
        QIODevice::open(mode);
        if (mode & Append)
            seek(size());
        return true;
    }
    QFile::FileError err = d->fileEngine->error();
    if (err == QFile::UnspecifiedError)
        err = QFile::OpenError;
    d->setError(err, d->fileEngine->errorString());
    return false;
}